

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btConvexConcaveCollisionAlgorithm::getAllContactManifolds
          (btConvexConcaveCollisionAlgorithm *this,btManifoldArray *manifoldArray)

{
  if ((this->m_btConvexTriangleCallback).m_manifoldPtr != (btPersistentManifold *)0x0) {
    btAlignedObjectArray<btPersistentManifold_*>::push_back
              (manifoldArray,&(this->m_btConvexTriangleCallback).m_manifoldPtr);
    return;
  }
  return;
}

Assistant:

void	btConvexConcaveCollisionAlgorithm::getAllContactManifolds(btManifoldArray&	manifoldArray)
{
	if (m_btConvexTriangleCallback.m_manifoldPtr)
	{
		manifoldArray.push_back(m_btConvexTriangleCallback.m_manifoldPtr);
	}
}